

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

bool cmCTestScriptHandler::RunScript
               (cmCTest *ctest,cmMakefile *mf,string *sname,bool InProcess,int *returnValue)

{
  int iVar1;
  pointer pcVar2;
  int res;
  unique_ptr<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_> local_38;
  __single_object sh;
  int *returnValue_local;
  bool InProcess_local;
  string *sname_local;
  cmMakefile *mf_local;
  cmCTest *ctest_local;
  
  sh._M_t.super___uniq_ptr_impl<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>.
  _M_t.super__Tuple_impl<0UL,_cmCTestScriptHandler_*,_std::default_delete<cmCTestScriptHandler>_>.
  super__Head_base<0UL,_cmCTestScriptHandler_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>,_true,_true>
       )(__uniq_ptr_data<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>,_true,_true>
         )returnValue;
  std::make_unique<cmCTestScriptHandler>();
  pcVar2 = std::unique_ptr<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>::
           operator->(&local_38);
  cmCTestGenericHandler::SetCTestInstance(&pcVar2->super_cmCTestGenericHandler,ctest);
  pcVar2 = std::unique_ptr<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>::
           operator->(&local_38);
  pcVar2->ParentMakefile = mf;
  pcVar2 = std::unique_ptr<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>::
           operator->(&local_38);
  AddConfigurationScript(pcVar2,sname,InProcess);
  pcVar2 = std::unique_ptr<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>::
           operator->(&local_38);
  iVar1 = (*(pcVar2->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
  if ((__uniq_ptr_impl<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>)
      sh._M_t.
      super___uniq_ptr_impl<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>._M_t.
      super__Tuple_impl<0UL,_cmCTestScriptHandler_*,_std::default_delete<cmCTestScriptHandler>_>.
      super__Head_base<0UL,_cmCTestScriptHandler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>)0x0) {
    *(int *)sh._M_t.
            super___uniq_ptr_impl<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmCTestScriptHandler_*,_std::default_delete<cmCTestScriptHandler>_>
            .super__Head_base<0UL,_cmCTestScriptHandler_*,_false>._M_head_impl = iVar1;
  }
  std::unique_ptr<cmCTestScriptHandler,_std::default_delete<cmCTestScriptHandler>_>::~unique_ptr
            (&local_38);
  return true;
}

Assistant:

bool cmCTestScriptHandler::RunScript(cmCTest* ctest, cmMakefile* mf,
                                     const std::string& sname, bool InProcess,
                                     int* returnValue)
{
  auto sh = cm::make_unique<cmCTestScriptHandler>();
  sh->SetCTestInstance(ctest);
  sh->ParentMakefile = mf;
  sh->AddConfigurationScript(sname, InProcess);
  int res = sh->ProcessHandler();
  if (returnValue) {
    *returnValue = res;
  }
  return true;
}